

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4afdb9::ParameterPack::hasArraySlow(ParameterPack *this,OutputStream *S)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (S->CurrentPackMax == 0xffffffff) {
    uVar3 = (this->Data).NumElements;
    S->CurrentPackMax = (uint)uVar3;
    S->CurrentPackIndex = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)S->CurrentPackIndex;
    uVar3 = (this->Data).NumElements;
  }
  if (uVar2 < uVar3) {
    bVar1 = Node::hasArray((this->Data).Elements[uVar2],S);
    return bVar1;
  }
  return false;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }